

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

int IDAArhsQ(sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector resvalQB,void *ida_mem)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  lVar1 = *(long *)((long)ida_mem + 0x840);
  lVar2 = *(long *)(lVar1 + 0x40);
  if (*(int *)(lVar1 + 0xc0) == 0) {
    if (*(int *)(lVar1 + 0xbc) == 0) {
      uVar4 = 0;
      uVar5 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(lVar1 + 0x168);
      uVar5 = *(undefined8 *)(lVar1 + 0x170);
    }
    iVar3 = (**(code **)(lVar1 + 0x98))
                      (ida_mem,*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),uVar4,
                       uVar5);
    if (iVar3 != 0) {
      IDAProcessError((IDAMem)ida_mem,-1,0xee6,"IDAArhsQ",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"Bad t = %.15g for interpolation.",tt);
      return -1;
    }
  }
  if (*(int *)(lVar2 + 0x1c) != 0) {
    iVar3 = (**(code **)(lVar2 + 0x38))
                      (*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),
                       *(undefined8 *)(lVar1 + 0x168),*(undefined8 *)(lVar1 + 0x170),yyB,ypB,
                       resvalQB,*(undefined8 *)(lVar2 + 0x40));
    return iVar3;
  }
  iVar3 = (**(code **)(lVar2 + 0x30))
                    (*(undefined8 *)(lVar1 + 0x158),*(undefined8 *)(lVar1 + 0x160),yyB,ypB,resvalQB,
                     *(undefined8 *)(lVar2 + 0x40));
  return iVar3;
}

Assistant:

static int IDAArhsQ(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                    N_Vector resvalQB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  int retval, flag;

  IDA_mem    = (IDAMem)ida_mem;
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Get current backward problem. */
  IDAB_mem = IDAADJ_mem->ia_bckpbCrt;

  retval = IDA_SUCCESS;

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    if (IDAADJ_mem->ia_interpSensi)
    {
      flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, IDAADJ_mem->ia_yySTmp,
                                 IDAADJ_mem->ia_ypSTmp);
    }
    else
    {
      flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    }

    if (flag != IDA_SUCCESS)
    {
      IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSGAM_BAD_TINTERP, tt);
      return (-1);
    }
  }

  /* Call user's adjoint quadrature RHS routine */
  if (IDAB_mem->ida_rhsQ_withSensi)
  {
    retval = IDAB_mem->ida_rhsQS(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                 IDAADJ_mem->ia_yySTmp, IDAADJ_mem->ia_ypSTmp,
                                 yyB, ypB, resvalQB, IDAB_mem->ida_user_data);
  }
  else
  {
    retval = IDAB_mem->ida_rhsQ(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                                yyB, ypB, resvalQB, IDAB_mem->ida_user_data);
  }
  return (retval);
}